

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

bool __thiscall miniscript::Node<unsigned_int>::CheckOpsLimit(Node<unsigned_int> *this)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsTapscript(this->m_script_ctx);
  bVar3 = 1;
  if (!bVar2) {
    bVar3 = (this->ops).sat.valid ^ 1U | (this->ops).sat.value + (this->ops).count < 0xca;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckOpsLimit() const {
        if (IsTapscript(m_script_ctx)) return true;
        if (const auto ops = GetOps()) return *ops <= MAX_OPS_PER_SCRIPT;
        return true;
    }